

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O3

void __thiscall logging_tests::logging_SeverityLevels::test_method(logging_SeverityLevels *this)

{
  bool bVar1;
  char cVar2;
  Logger *pLVar3;
  istream *piVar4;
  char *pcVar5;
  iterator in_R9;
  long *plVar6;
  long lVar7;
  long in_FS_OFFSET;
  string_view category_str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file_00;
  const_string msg;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view level_str;
  char *local_2d8;
  char *local_2d0;
  equal_coll_impl local_2c1;
  assertion_result local_2c0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  string log;
  ifstream file;
  char local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  long *local_1b0 [2];
  long local_1a0 [47];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar3 = LogInstance();
  BCLog::Logger::EnableCategory(pLVar3,ALL);
  pLVar3 = LogInstance();
  LOCK();
  (pLVar3->m_log_level)._M_i = Debug;
  UNLOCK();
  pLVar3 = LogInstance();
  category_str._M_str = "net";
  category_str._M_len = 3;
  level_str._M_str = "info";
  level_str._M_len = 4;
  pcVar5 = "info";
  BCLog::Logger::SetCategoryLogLevel(pLVar3,category_str,level_str);
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,HTTP,Info);
  if (bVar1) {
    in_R9 = &DAT_00000008;
    pcVar5 = (char *)0xc1;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file._M_len = 0x66;
    logging_function._M_str = "test_method";
    logging_function._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function,source_file,0xc1,HTTP,Info,(ConstevalFormatString<1U>)0xe7ebb0,
               (char (*) [5])0xe7ec89);
  }
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,MEMPOOL,Trace);
  if (bVar1) {
    in_R9 = (iterator)0x4;
    pcVar5 = (char *)0xc2;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_00._M_len = 0x66;
    logging_function_00._M_str = "test_method";
    logging_function_00._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_00,source_file_00,0xc2,MEMPOOL,Trace,
               (ConstevalFormatString<1U>)0xe7ebba,(char (*) [5])0xe7e989);
  }
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,VALIDATION,Warning);
  if (bVar1) {
    in_R9 = (iterator)0x200000;
    pcVar5 = (char *)0xc3;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_01._M_len = 0x66;
    logging_function_01._M_str = "test_method";
    logging_function_01._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_01,source_file_01,0xc3,VALIDATION,Warning,
               (ConstevalFormatString<1U>)0xe7ebf2,(char (*) [5])0xe7eca9);
  }
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,RPC,Error);
  if (bVar1) {
    in_R9 = (iterator)0x80;
    pcVar5 = (char *)0xc4;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_02._M_len = 0x66;
    logging_function_02._M_str = "test_method";
    logging_function_02._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_02,source_file_02,0xc4,RPC,Error,(ConstevalFormatString<1U>)0xe7ea53
               ,(char (*) [5])0xe7e9c5);
  }
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Warning);
  if (bVar1) {
    in_R9 = (iterator)0x1;
    pcVar5 = (char *)0xc7;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_03._M_len = 0x66;
    logging_function_03._M_str = "test_method";
    logging_function_03._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_03,source_file_03,199,NET,Warning,
               (ConstevalFormatString<1U>)0xe7ea49,(char (*) [5])0xe7ecd9);
  }
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
  if (bVar1) {
    in_R9 = (iterator)0x1;
    pcVar5 = (char *)0xc8;
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_04._M_len = 0x66;
    logging_function_04._M_str = "test_method";
    logging_function_04._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_04,source_file_04,200,NET,Debug,(ConstevalFormatString<1U>)0xe7ebfc,
               (char (*) [5])0xe7ea01);
  }
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Error);
  if (bVar1) {
    in_R9 = (iterator)0x1;
    pcVar5 = (char *)0xc9;
    source_file_05._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_05._M_len = 0x66;
    logging_function_05._M_str = "test_method";
    logging_function_05._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_05,source_file_05,0xc9,NET,Error,(ConstevalFormatString<1U>)0xe7ea5d
               ,(char (*) [5])0xe7ecf0);
  }
  _file = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&file,"[http:info] foo1: bar1","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"[validation:warning] foo3: bar3","");
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"[rpc:error] foo4: bar4","");
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"[net:warning] foo5: bar5","")
  ;
  plVar6 = local_1a0;
  local_1b0[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"[net:error] foo7: bar7","");
  __l._M_len = 5;
  __l._M_array = (iterator)&file;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expected,__l,(allocator_type *)&log);
  lVar7 = -0xa0;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  std::ifstream::ifstream
            ((istream *)&file,
             (this->super_LogSetup).tmp_log_path.super_path._M_pathname._M_dataplus._M_p,_S_in);
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  log._M_string_length = 0;
  log.field_2._M_allocated_capacity = log.field_2._M_allocated_capacity & 0xffffffffffffff00;
  log._M_dataplus._M_p = (pointer)&log.field_2;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(_file + -0x18) + (char)(istream *)&file);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&log,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&log_lines,&log);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)log._M_dataplus._M_p != &log.field_2) {
    operator_delete(log._M_dataplus._M_p,log.field_2._M_allocated_capacity + 1);
  }
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xd7;
  file_00.m_begin = (iterator)&local_298;
  msg.m_end = in_R9;
  msg.m_begin = pcVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2a8,msg);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_2c0,&local_2c1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  log._M_string_length = log._M_string_length & 0xffffffffffffff00;
  log._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  log.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  log.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_2d0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_2c0,(lazy_ostream *)&log,1,0xd,4,0xe7ea06,(size_t)&local_2d8,0xd7,
             "log_lines.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_2c0.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&log_lines);
  std::ifstream::~ifstream(&file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expected);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_SeverityLevels, LogSetup)
{
    LogInstance().EnableCategory(BCLog::LogFlags::ALL);

    LogInstance().SetLogLevel(BCLog::Level::Debug);
    LogInstance().SetCategoryLogLevel(/*category_str=*/"net", /*level_str=*/"info");

    // Global log level
    LogPrintLevel(BCLog::HTTP, BCLog::Level::Info, "foo1: %s\n", "bar1");
    LogPrintLevel(BCLog::MEMPOOL, BCLog::Level::Trace, "foo2: %s. This log level is lower than the global one.\n", "bar2");
    LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Warning, "foo3: %s\n", "bar3");
    LogPrintLevel(BCLog::RPC, BCLog::Level::Error, "foo4: %s\n", "bar4");

    // Category-specific log level
    LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "foo5: %s\n", "bar5");
    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "foo6: %s. This log level is the same as the global one but lower than the category-specific one, which takes precedence. \n", "bar6");
    LogPrintLevel(BCLog::NET, BCLog::Level::Error, "foo7: %s\n", "bar7");

    std::vector<std::string> expected = {
        "[http:info] foo1: bar1",
        "[validation:warning] foo3: bar3",
        "[rpc:error] foo4: bar4",
        "[net:warning] foo5: bar5",
        "[net:error] foo7: bar7",
    };
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}